

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_bcast_2tree_multiple
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  bsc_step_t bVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar3;
  }
  bVar1 = depends;
  for (; uVar2 * 0x30 - uVar3 != 0; uVar3 = uVar3 + 0x30) {
    bVar1 = bsc_bcast_qtree_single
                      (depends,root,group,*(void **)((long)&params->src + uVar3),
                       *(void **)((long)&params->dst + uVar3),
                       *(bsc_size_t *)((long)&params->size + uVar3),2);
  }
  return bVar1;
}

Assistant:

bsc_step_t bsc_bcast_2tree_multiple( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    bsc_size_t i;
    bsc_step_t finished = depends;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_bcast_qtree_single( depends, root, group,
                params[i].src, params[i].dst, params[i].size, 2 );
    }

    return finished;
}